

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_selectable_image_text
              (nk_context *ctx,nk_image img,char *str,int len,nk_flags align,int *value)

{
  float fVar1;
  float fVar2;
  int iVar3;
  nk_window *pnVar4;
  nk_panel *pnVar5;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  nk_widget_layout_states nVar9;
  int iVar10;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  nk_context *i;
  nk_command_buffer *out;
  float fVar11;
  nk_rect r;
  nk_rect local_88;
  float local_78;
  int local_74;
  float local_70;
  float local_6c;
  ulong local_68;
  undefined8 local_60;
  char *local_58;
  nk_rect local_50;
  nk_rect bounds;
  
  local_60 = CONCAT44(in_register_00000014,len);
  local_68 = CONCAT44(in_register_0000000c,align);
  local_58 = str;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x51c9,
                  "int nk_selectable_image_text(struct nk_context *, struct nk_image, const char *, int, nk_flags, int *)"
                 );
  }
  if (value == (int *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x51ca,
                  "int nk_selectable_image_text(struct nk_context *, struct nk_image, const char *, int, nk_flags, int *)"
                 );
  }
  pnVar4 = ctx->current;
  if (pnVar4 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x51cb,
                  "int nk_selectable_image_text(struct nk_context *, struct nk_image, const char *, int, nk_flags, int *)"
                 );
  }
  pnVar5 = pnVar4->layout;
  if (pnVar5 != (nk_panel *)0x0) {
    nVar9 = nk_widget(&bounds,ctx);
    if (nVar9 != NK_WIDGET_INVALID) {
      i = (nk_context *)0x0;
      if ((nVar9 != NK_WIDGET_ROM) && ((pnVar5->flags & 0x1000) == 0)) {
        i = ctx;
      }
      font = (ctx->style).font;
      local_50.x = bounds.x;
      local_50.y = bounds.y;
      uVar7 = local_50._0_8_;
      local_50.w = bounds.w;
      local_50.h = bounds.h;
      uVar8 = local_50._8_8_;
      if (local_58 == (char *)0x0) {
        __assert_fail("str",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x396a,
                      "int nk_do_selectable_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_image *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                     );
      }
      if ((int)local_60 == 0) {
        __assert_fail("len",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x396b,
                      "int nk_do_selectable_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_image *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                     );
      }
      if (font == (nk_user_font *)0x0) {
        __assert_fail("font",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x396e,
                      "int nk_do_selectable_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_image *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                     );
      }
      iVar3 = *value;
      local_50.x = bounds.x;
      fVar2 = local_50.x;
      local_50.y = bounds.y;
      fVar1 = (ctx->style).selectable.touch_padding.x;
      fVar11 = (ctx->style).selectable.touch_padding.y;
      r.x = local_50.x - fVar1;
      local_6c = local_50.y;
      local_50.w = bounds.w;
      local_78 = local_50.w;
      r.w = fVar1 + fVar1 + local_50.w;
      local_50.h = bounds.h;
      local_70 = local_50.h;
      r.h = fVar11 + fVar11 + local_50.h;
      r.y = local_50.y - fVar11;
      local_50._0_8_ = uVar7;
      local_50._8_8_ = uVar8;
      iVar10 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
      if (iVar10 != 0) {
        *value = (uint)(*value == 0);
      }
      fVar1 = (ctx->style).selectable.padding.y;
      local_88.h = local_70 - (fVar1 + fVar1);
      if ((local_68 & 1) == 0) {
        fVar11 = (ctx->style).selectable.padding.x;
        local_88.x = fVar11 + fVar11 + fVar2;
      }
      else {
        fVar11 = (ctx->style).selectable.padding.x;
        fVar11 = (fVar2 + local_78) - (fVar11 + fVar11 + local_88.h);
        local_88.x = 0.0;
        if (0.0 <= fVar11) {
          local_88.x = fVar11;
        }
      }
      out = &pnVar4->buffer;
      fVar11 = (ctx->style).selectable.image_padding.x;
      local_88.x = local_88.x + fVar11;
      fVar2 = (ctx->style).selectable.image_padding.y;
      local_88.y = local_6c + fVar1 + fVar2;
      local_88.w = local_88.h - (fVar11 + fVar11);
      local_88.h = local_88.h - (fVar2 + fVar2);
      p_Var6 = (ctx->style).selectable.draw_begin;
      local_74 = iVar3;
      if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var6)(out,(nk_handle)(ctx->style).selectable.userdata.ptr);
      }
      nk_draw_selectable(out,ctx->last_widget_state,&(ctx->style).selectable,*value,&local_50,
                         &local_88,&img,local_58,(int)local_60,(nk_flags)local_68,font);
      p_Var6 = (ctx->style).selectable.draw_end;
      if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var6)(out,(nk_handle)(ctx->style).selectable.userdata.ptr);
      }
      nVar9 = (nk_widget_layout_states)(local_74 != *value);
    }
    return nVar9;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x51cc,
                "int nk_selectable_image_text(struct nk_context *, struct nk_image, const char *, int, nk_flags, int *)"
               );
}

Assistant:

NK_API int
nk_selectable_image_text(struct nk_context *ctx, struct nk_image img,
    const char *str, int len, nk_flags align, int *value)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;
    const struct nk_style *style;

    enum nk_widget_layout_states state;
    struct nk_rect bounds;

    NK_ASSERT(ctx);
    NK_ASSERT(value);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !value)
        return 0;

    win = ctx->current;
    layout = win->layout;
    style = &ctx->style;

    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    return nk_do_selectable_image(&ctx->last_widget_state, &win->buffer, bounds,
                str, len, align, value, &img, &style->selectable, in, style->font);
}